

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O0

bool LEARNER::example_is_newline_not_header(example *ec)

{
  bool bVar1;
  int iVar2;
  example *in_stack_00000008;
  example *in_stack_ffffffffffffffe8;
  undefined1 local_9;
  
  iVar2 = example_is_newline(in_stack_ffffffffffffffe8);
  local_9 = 0;
  if (iVar2 != 0) {
    bVar1 = ec_is_example_header(in_stack_00000008);
    local_9 = bVar1 ^ 0xff;
  }
  return (bool)(local_9 & 1);
}

Assistant:

inline bool example_is_newline_not_header(example& ec) { return (example_is_newline(ec) && !ec_is_example_header(ec)); }